

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_meta.c
# Opt level: O3

void lj_meta_init(lua_State *L)

{
  char cVar1;
  uint uVar2;
  GCstr *pGVar3;
  ulong uVar4;
  char *str;
  size_t lenx;
  
  uVar2 = (L->glref).ptr32;
  uVar4 = 0;
  str = 
  "__index__newindex__gc__mode__eq__len__lt__le__concat__call__add__sub__mul__div__mod__pow__unm__metatable__tostring__new__pairs__ipairs"
  ;
  do {
    for (lenx = 2; (cVar1 = str[lenx], cVar1 != '\0' && (cVar1 != '_')); lenx = lenx + 1) {
    }
    pGVar3 = lj_str_new(L,str,lenx);
    *(int *)((ulong)uVar2 + 0x198 + uVar4 * 4) = (int)pGVar3;
    uVar4 = (ulong)((int)uVar4 + 1);
    str = str + lenx;
  } while (cVar1 != '\0');
  return;
}

Assistant:

void lj_meta_init(lua_State *L)
{
#define MMNAME(name)	"__" #name
  const char *metanames = MMDEF(MMNAME);
#undef MMNAME
  global_State *g = G(L);
  const char *p, *q;
  uint32_t mm;
  for (mm = 0, p = metanames; *p; mm++, p = q) {
    GCstr *s;
    for (q = p+2; *q && *q != '_'; q++) ;
    s = lj_str_new(L, p, (size_t)(q-p));
    /* NOBARRIER: g->gcroot[] is a GC root. */
    setgcref(g->gcroot[GCROOT_MMNAME+mm], obj2gco(s));
  }
}